

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void InitSegmentJob(VP8Encoder *enc,SegmentJob *job,int start_row,int end_row)

{
  WebPWorkerInterface *pWVar1;
  int in_ECX;
  proba_t pVar2;
  int in_EDX;
  VP8Encoder *in_RSI;
  long in_RDI;
  
  pWVar1 = WebPGetWorkerInterface();
  (*pWVar1->Init)((WebPWorker *)in_RSI);
  *(VP8Encoder **)&(in_RSI->filter_hdr).sharpness = in_RSI;
  *(uint16_t **)&in_RSI->segment_hdr = in_RSI->dqm[0].uv.q + 0xc;
  *(code **)&in_RSI->filter_hdr = DoSegmentsJob;
  VP8IteratorInit(in_RSI,(VP8EncIterator *)CONCAT44(in_EDX,in_ECX));
  VP8IteratorSetRow((VP8EncIterator *)in_RSI,in_EDX);
  VP8IteratorSetCountDown
            ((VP8EncIterator *)(in_RSI->dqm[0].uv.q + 0xc),
             (in_ECX - in_EDX) * *(int *)(in_RDI + 0x30));
  memset(&in_RSI->mb_w,0,0x400);
  in_RSI->dqm[0].uv.q[8] = 0;
  in_RSI->dqm[0].uv.q[9] = 0;
  in_RSI->dqm[0].uv.q[10] = 0;
  in_RSI->dqm[0].uv.q[0xb] = 0;
  pVar2 = 0;
  if (in_EDX == 0) {
    pVar2 = 0x14;
  }
  (in_RSI->proba).stats[0][1][2][8] = pVar2;
  return;
}

Assistant:

static void InitSegmentJob(VP8Encoder* const enc, SegmentJob* const job,
                           int start_row, int end_row) {
  WebPGetWorkerInterface()->Init(&job->worker);
  job->worker.data1 = job;
  job->worker.data2 = &job->it;
  job->worker.hook = DoSegmentsJob;
  VP8IteratorInit(enc, &job->it);
  VP8IteratorSetRow(&job->it, start_row);
  VP8IteratorSetCountDown(&job->it, (end_row - start_row) * enc->mb_w);
  memset(job->alphas, 0, sizeof(job->alphas));
  job->alpha = 0;
  job->uv_alpha = 0;
  // only one of both jobs can record the progress, since we don't
  // expect the user's hook to be multi-thread safe
  job->delta_progress = (start_row == 0) ? 20 : 0;
}